

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildmidi_lib.cpp
# Opt level: O1

_patch * get_patch_data(unsigned_short patchid)

{
  uint uVar1;
  _patch *p_Var2;
  
  uVar1 = (uint)patchid;
  while( true ) {
    FCriticalSection::Enter(&patch_lock);
    p_Var2 = patch[uVar1 & 0x7f];
    if (p_Var2 == (_patch *)0x0) {
      FCriticalSection::Leave(&patch_lock);
      return (_patch *)0x0;
    }
    do {
      if (p_Var2->patchid == (unsigned_short)uVar1) {
        FCriticalSection::Leave(&patch_lock);
        return p_Var2;
      }
      p_Var2 = p_Var2->next;
    } while (p_Var2 != (_patch *)0x0);
    FCriticalSection::Leave(&patch_lock);
    if (uVar1 < 0x100) break;
    uVar1 = uVar1 & 0xff;
  }
  return (_patch *)0x0;
}

Assistant:

static struct _patch *
get_patch_data(unsigned short patchid) {
	struct _patch *search_patch;

	patch_lock.Enter();

	search_patch = patch[patchid & 0x007F];

	if (search_patch == NULL) {
		patch_lock.Leave();
		return NULL;
	}

	while (search_patch) {
		if (search_patch->patchid == patchid) {
			patch_lock.Leave();
			return search_patch;
		}
		search_patch = search_patch->next;
	}
	if ((patchid >> 8) != 0) {
		patch_lock.Leave();
		return (get_patch_data(patchid & 0x00FF));
	}
	patch_lock.Leave();
	return NULL;
}